

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::write_val
          (string *__return_storage_ptr__,t_st_generator *this,t_type *t,string *fname)

{
  string *psVar1;
  uint uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  t_base local_2c;
  string *psStack_28;
  t_base tbase;
  string *fname_local;
  t_type *t_local;
  t_st_generator *this_local;
  
  psStack_28 = fname;
  fname_local = (string *)t;
  t_local = (t_type *)this;
  this_local = (t_st_generator *)__return_storage_ptr__;
  fname_local = (string *)t_generator::get_true_type(t);
  uVar2 = (*(((t_type *)fname_local)->super_t_doc)._vptr_t_doc[5])();
  if ((uVar2 & 1) == 0) {
    uVar3 = (**(code **)(*(long *)fname_local + 0x80))();
    psVar1 = fname_local;
    if ((uVar3 & 1) == 0) {
      uVar3 = (**(code **)(*(long *)fname_local + 0x58))();
      if (((uVar3 & 1) == 0) &&
         (uVar3 = (**(code **)(*(long *)fname_local + 0x60))(), (uVar3 & 1) == 0)) {
        uVar3 = (**(code **)(*(long *)fname_local + 0x70))();
        psVar1 = fname_local;
        if ((uVar3 & 1) != 0) {
          std::__cxx11::string::string((string *)&local_1e0,(string *)fname);
          list_writer(__return_storage_ptr__,this,(t_list *)psVar1,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          return __return_storage_ptr__;
        }
        uVar3 = (**(code **)(*(long *)fname_local + 0x78))();
        psVar1 = fname_local;
        if ((uVar3 & 1) == 0) {
          uVar3 = (**(code **)(*(long *)fname_local + 0x50))();
          if ((uVar3 & 1) != 0) {
            std::operator+(__return_storage_ptr__,"iprot writeI32: ",fname);
            return __return_storage_ptr__;
          }
          __return_storage_ptr___00 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
          type_name_abi_cxx11_(&local_220,this,(t_type *)fname_local);
          std::operator+(__return_storage_ptr___00,"Sorry, I don\'t know how to write this: ",
                         &local_220);
          __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        std::__cxx11::string::string((string *)&local_200,(string *)fname);
        set_writer(__return_storage_ptr__,this,(t_set *)psVar1,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        return __return_storage_ptr__;
      }
      psVar1 = fname_local;
      std::__cxx11::string::string((string *)&local_1c0,(string *)fname);
      struct_writer(__return_storage_ptr__,this,(t_struct *)psVar1,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    else {
      std::__cxx11::string::string((string *)&local_1a0,(string *)fname);
      map_writer(__return_storage_ptr__,this,(t_map *)psVar1,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
  }
  else {
    local_2c = t_base_type::get_base((t_base_type *)fname_local);
    if (local_2c - TYPE_I8 < 4) {
      type_name_abi_cxx11_(&local_100,this,(t_type *)fname_local);
      t_generator::capitalize(&local_e0,(t_generator *)this,&local_100);
      std::operator+(&local_c0,"iprot write",&local_e0);
      std::operator+(&local_a0,&local_c0,": ");
      std::operator+(&local_80,&local_a0,fname);
      std::operator+(__return_storage_ptr__,&local_80," asInteger");
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else if (local_2c == TYPE_DOUBLE) {
      std::operator+(&local_50,"iprot writeDouble: ",fname);
      std::operator+(__return_storage_ptr__,&local_50," asFloat");
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      type_name_abi_cxx11_(&local_180,this,(t_type *)fname_local);
      t_generator::capitalize(&local_160,(t_generator *)this,&local_180);
      std::operator+(&local_140,"iprot write",&local_160);
      std::operator+(&local_120,&local_140,": ");
      std::operator+(__return_storage_ptr__,&local_120,fname);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::write_val(t_type* t, string fname) {
  t = get_true_type(t);

  if (t->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)t)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_DOUBLE:
      return "iprot writeDouble: " + fname + " asFloat";
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      return "iprot write" + capitalize(type_name(t)) + ": " + fname + " asInteger";
    default:
      return "iprot write" + capitalize(type_name(t)) + ": " + fname;
    }
  } else if (t->is_map()) {
    return map_writer((t_map*)t, fname);
  } else if (t->is_struct() || t->is_xception()) {
    return struct_writer((t_struct*)t, fname);
  } else if (t->is_list()) {
    return list_writer((t_list*)t, fname);
  } else if (t->is_set()) {
    return set_writer((t_set*)t, fname);
  } else if (t->is_enum()) {
    return "iprot writeI32: " + fname;
  } else {
    throw "Sorry, I don't know how to write this: " + type_name(t);
  }
}